

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha512_Raw(sha2_byte *data,size_t len,uint8_t *digest)

{
  SHA512_CTX context;
  SHA512_CTX local_f0;
  
  sha512_Init(&local_f0);
  sha512_Update(&local_f0,data,len);
  sha512_Final(&local_f0,digest);
  return;
}

Assistant:

void sha512_Raw(const sha2_byte* data, size_t len, uint8_t digest[SHA512_DIGEST_LENGTH]) {
    trezor::SHA512_CTX	context;
	sha512_Init(&context);
	sha512_Update(&context, data, len);
	sha512_Final(&context, digest);
}